

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3JournalOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pJfd,int flags,int nSpill)

{
  int iVar1;
  
  pJfd[8].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[9].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[7].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[4].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
  pJfd[3].pMethods = (sqlite3_io_methods *)0x0;
  pJfd->pMethods = (sqlite3_io_methods *)0x0;
  pJfd[1].pMethods = (sqlite3_io_methods *)0x0;
  if (nSpill != 0) {
    iVar1 = 0x3f8;
    if (0 < nSpill) {
      iVar1 = nSpill;
    }
    *(int *)&pJfd[1].pMethods = iVar1;
    pJfd->pMethods = &MemJournalMethods;
    *(int *)((long)&pJfd[1].pMethods + 4) = nSpill;
    *(int *)&pJfd[7].pMethods = flags;
    pJfd[9].pMethods = (sqlite3_io_methods *)zName;
    pJfd[8].pMethods = (sqlite3_io_methods *)pVfs;
    return 0;
  }
  iVar1 = (*pVfs->xOpen)(pVfs,zName,pJfd,flags & 0x1087f7f,(int *)0x0);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3JournalOpen(
  sqlite3_vfs *pVfs,         /* The VFS to use for actual file I/O */
  const char *zName,         /* Name of the journal file */
  sqlite3_file *pJfd,        /* Preallocated, blank file handle */
  int flags,                 /* Opening flags */
  int nSpill                 /* Bytes buffered before opening the file */
){
  MemJournal *p = (MemJournal*)pJfd;

  /* Zero the file-handle object. If nSpill was passed zero, initialize
  ** it using the sqlite3OsOpen() function of the underlying VFS. In this
  ** case none of the code in this module is executed as a result of calls
  ** made on the journal file-handle.  */
  memset(p, 0, sizeof(MemJournal));
  if( nSpill==0 ){
    return sqlite3OsOpen(pVfs, zName, pJfd, flags, 0);
  }

  if( nSpill>0 ){
    p->nChunkSize = nSpill;
  }else{
    p->nChunkSize = 8 + MEMJOURNAL_DFLT_FILECHUNKSIZE - sizeof(FileChunk);
    assert( MEMJOURNAL_DFLT_FILECHUNKSIZE==fileChunkSize(p->nChunkSize) );
  }

  pJfd->pMethods = (const sqlite3_io_methods*)&MemJournalMethods;
  p->nSpill = nSpill;
  p->flags = flags;
  p->zJournal = zName;
  p->pVfs = pVfs;
  return SQLITE_OK;
}